

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

string * __thiscall
do_read_stdin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
operator()(string *__return_storage_ptr__,
          do_read_stdin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this)

{
  allocator<char> local_41;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_40;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_38;
  undefined1 local_30 [8];
  vector<char,_std::allocator<char>_> vec;
  do_read_stdin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  vec.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = this;
  ::wasm::read_stdin();
  local_38._M_current =
       (char *)std::vector<char,_std::allocator<char>_>::begin
                         ((vector<char,_std::allocator<char>_> *)local_30);
  local_40._M_current =
       (char *)std::vector<char,_std::allocator<char>_>::end
                         ((vector<char,_std::allocator<char>_> *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::
  string<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
            ((string *)__return_storage_ptr__,local_38,local_40,&local_41);
  std::allocator<char>::~allocator(&local_41);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_30)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string do_read_stdin<std::string>::operator()() {
  auto vec = wasm::read_stdin();
  return std::string(vec.begin(), vec.end());
}